

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O3

OCSPRevocationStatus
bssl::anon_unknown_20::GetRevocationStatusForCert
          (OCSPResponseData *response_data,ParsedCertificate *cert,
          ParsedCertificate *issuer_certificate,int64_t verify_time_epoch_seconds,
          optional<long> max_age_seconds,ResponseStatus *response_details)

{
  _Rb_tree_node_base *p_Var1;
  Input *pIVar2;
  uint uVar3;
  OCSPRevocationStatus OVar4;
  Input lhs;
  Input hash;
  Input hash_00;
  Input lhs_00;
  Input value;
  Input raw_tlv;
  Input extensions_tlv;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  EVP_MD *type;
  uint *spk_tlv;
  GeneralizedTime *this_update;
  int64_t iVar7;
  Input raw_tlv_00;
  Input spki_tlv;
  Input rhs;
  optional<long> max_age_seconds_00;
  uint *in_stack_00000010;
  OCSPSingleResponse single_response;
  OCSPRevocationStatus local_e8;
  undefined1 local_e0 [12];
  undefined4 uStack_d4;
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  _Base_ptr p_Stack_c0;
  uchar *local_b8;
  size_t sStack_b0;
  OCSPSingleResponse *local_a8;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  _Storage<long,_true> local_90;
  int64_t local_88;
  int64_t local_80;
  uchar *local_78;
  size_t sStack_70;
  OCSPRevocationStatus local_68;
  bssl local_54 [8];
  char local_4c;
  GeneralizedTime local_4a;
  char local_42;
  uchar *local_40;
  size_t sStack_38;
  
  iVar7 = max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_;
  local_90._M_value =
       max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  *in_stack_00000010 = 5;
  if ((ParsedCertificate *)response_data == cert) {
LAB_004a510f:
    local_e8 = MAX_VALUE;
  }
  else {
    p_Var1 = (_Rb_tree_node_base *)(local_e0 + 8);
    local_e8 = MAX_VALUE;
    local_88 = iVar7;
    local_80 = verify_time_epoch_seconds;
    do {
      local_78 = (uchar *)0x0;
      sStack_70 = 0;
      local_40 = (uchar *)0x0;
      sStack_38 = 0;
      raw_tlv_00.data_.size_ = (size_t)&local_78;
      raw_tlv_00.data_.data_ = *(uchar **)&(response_data->responder_id).type;
      bVar5 = ParseOCSPSingleResponse
                        (*(bssl **)&response_data->version,raw_tlv_00,
                         (OCSPSingleResponse *)verify_time_epoch_seconds);
      if (!bVar5) goto LAB_004a510f;
      if (local_42 == '\x01') {
        extensions_tlv.data_.size_ = sStack_38;
        extensions_tlv.data_.data_ = local_40;
        local_e0._8_4_ = _S_red;
        p_Stack_d0 = (_Base_ptr)0x0;
        local_b8 = (uchar *)0x0;
        local_c8 = p_Var1;
        p_Stack_c0 = p_Var1;
        bVar5 = ParseExtensions(extensions_tlv,
                                (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                 *)local_e0);
        if (!bVar5) {
          *in_stack_00000010 = 8;
LAB_004a5105:
          ::std::
          _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
          ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                       *)local_e0);
          goto LAB_004a510f;
        }
        local_a8 = (OCSPSingleResponse *)0x279d6010401062b;
        uStack_a0 = 0x504;
        for (p_Var6 = local_c8; p_Var6 != p_Var1;
            p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
          lhs.data_.data_ = (uchar *)p_Var6[1]._M_left;
          lhs.data_.size_ = (size_t)p_Var6[1]._M_right;
          rhs.data_.size_ = 10;
          rhs.data_.data_ = (uchar *)&local_a8;
          bVar5 = bssl::der::operator==(lhs,rhs);
          if ((!bVar5) && (*(char *)&p_Var6[2]._M_left != '\0')) {
            *in_stack_00000010 = 9;
            goto LAB_004a5105;
          }
        }
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
        ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                     *)local_e0);
      }
      local_b8 = (uchar *)0x0;
      sStack_b0 = 0;
      local_c8 = (_Base_ptr)0x0;
      p_Stack_c0 = (_Base_ptr)0x0;
      local_e0._8_4_ = _S_red;
      uStack_d4 = 0;
      p_Stack_d0 = (_Base_ptr)0x0;
      raw_tlv.data_.size_ = sStack_70;
      raw_tlv.data_.data_ = local_78;
      bVar5 = ParseOCSPCertID(raw_tlv,(OCSPCertID *)local_e0);
      if (!bVar5) goto LAB_004a510f;
      spk_tlv = &switchD_004a4fa8::switchdataD_00598f08;
      switch(local_e0._0_4_) {
      case 0:
      case 1:
      case 2:
        goto switchD_004a4fa8_caseD_0;
      case 3:
        type = EVP_sha1();
        break;
      case 4:
        type = EVP_sha256();
        break;
      case 5:
        type = EVP_sha384();
        break;
      case 6:
        type = EVP_sha512();
        break;
      default:
        type = (EVP_MD *)0x0;
      }
      hash.data_.data_._4_4_ = uStack_d4;
      hash.data_.data_._0_4_ = local_e0._8_4_;
      hash.data_.size_ = (size_t)p_Stack_d0;
      pIVar2 = &(issuer_certificate->tbs_).issuer_tlv;
      spk_tlv = (uint *)(pIVar2->data_).data_;
      bVar5 = VerifyHash((EVP_MD *)type,hash,(Input)pIVar2->data_);
      if (bVar5) {
        local_a8 = (OCSPSingleResponse *)0x0;
        uStack_a0 = 0;
        uStack_9e = 0;
        spki_tlv.data_.size_ = (size_t)&local_a8;
        spki_tlv.data_.data_ = *(uchar **)(local_80 + 0xb0);
        bVar5 = GetSubjectPublicKeyBytes
                          (*(anon_unknown_20 **)(local_80 + 0xa8),spki_tlv,(Input *)spk_tlv);
        if ((bVar5) &&
           (hash_00.data_.size_ = (size_t)p_Stack_c0, hash_00.data_.data_ = (uchar *)local_c8,
           value.data_.size_._0_2_ = uStack_a0, value.data_.data_ = (uchar *)local_a8,
           value.data_.size_._2_6_ = uStack_9e, spk_tlv = (uint *)local_a8,
           bVar5 = VerifyHash((EVP_MD *)type,hash_00,value), bVar5)) {
          lhs_00.data_.size_ = sStack_b0;
          lhs_00.data_.data_ = local_b8;
          spk_tlv = (uint *)(issuer_certificate->tbs_).serial_number.data_.size_;
          bVar5 = bssl::der::operator==
                            (lhs_00,(Input)(issuer_certificate->tbs_).serial_number.data_);
          if (bVar5) {
            this_update = (GeneralizedTime *)0x0;
            if (local_4c != '\0') {
              this_update = &local_4a;
            }
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value = (ulong)response_details & 0xff;
            max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = iVar7;
            bVar5 = CheckRevocationDateValid
                              (local_54,this_update,(GeneralizedTime *)local_90,local_88,
                               max_age_seconds_00);
            uVar3 = *in_stack_00000010;
            spk_tlv = (uint *)(ulong)uVar3;
            if (bVar5) {
              OVar4 = local_e8;
              if (local_68 == REVOKED) {
                OVar4 = local_68;
              }
              if (local_e8 == GOOD) {
                OVar4 = local_68;
              }
              local_e8 = OVar4;
              if (uVar3 != 2) {
                local_e8 = local_68;
              }
              *in_stack_00000010 = 2;
            }
            else if (uVar3 != 2) {
              *in_stack_00000010 = 6;
            }
          }
        }
      }
switchD_004a4fa8_caseD_0:
      response_data = (OCSPResponseData *)&(response_data->responder_id).name;
      verify_time_epoch_seconds = (int64_t)spk_tlv;
    } while ((ParsedCertificate *)response_data != cert);
  }
  return local_e8;
}

Assistant:

OCSPRevocationStatus GetRevocationStatusForCert(
    const OCSPResponseData &response_data, const ParsedCertificate *cert,
    const ParsedCertificate *issuer_certificate,
    int64_t verify_time_epoch_seconds, std::optional<int64_t> max_age_seconds,
    OCSPVerifyResult::ResponseStatus *response_details) {
  OCSPRevocationStatus result = OCSPRevocationStatus::UNKNOWN;
  *response_details = OCSPVerifyResult::NO_MATCHING_RESPONSE;

  for (const auto &single_response_der : response_data.responses) {
    // In the common case, there should only be one SingleResponse in the
    // ResponseData (matching the certificate requested and used on this
    // connection). However, it is possible for the OCSP responder to provide
    // multiple responses for multiple certificates. Look through all the
    // provided SingleResponses, and check to see if any match the
    // certificate. A SingleResponse matches a certificate if it has the same
    // serial number, issuer name (hash), and issuer public key (hash).
    OCSPSingleResponse single_response;
    if (!ParseOCSPSingleResponse(single_response_der, &single_response)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    // Reject unhandled critical extensions in SingleResponse
    if (single_response.has_extensions &&
        !ParseOCSPSingleResponseExtensions(single_response.extensions,
                                           response_details)) {
      return OCSPRevocationStatus::UNKNOWN;
    }

    OCSPCertID cert_id;
    if (!ParseOCSPCertID(single_response.cert_id_tlv, &cert_id)) {
      return OCSPRevocationStatus::UNKNOWN;
    }
    if (!CheckCertIDMatchesCertificate(cert_id, cert, issuer_certificate)) {
      continue;
    }

    // The SingleResponse matches the certificate, but may be out of date. Out
    // of date responses are noted seperate from responses with mismatched
    // serial numbers. If an OCSP responder provides both an up to date
    // response and an expired response, the up to date response takes
    // precedence (PROVIDED > INVALID_DATE).
    if (!CheckRevocationDateValid(single_response.this_update,
                                  single_response.has_next_update
                                      ? &single_response.next_update
                                      : nullptr,
                                  verify_time_epoch_seconds, max_age_seconds)) {
      if (*response_details != OCSPVerifyResult::PROVIDED) {
        *response_details = OCSPVerifyResult::INVALID_DATE;
      }
      continue;
    }

    // In the case with multiple matching and up to date responses, keep only
    // the strictest status (REVOKED > UNKNOWN > GOOD).
    if (*response_details != OCSPVerifyResult::PROVIDED ||
        result == OCSPRevocationStatus::GOOD ||
        single_response.cert_status.status == OCSPRevocationStatus::REVOKED) {
      result = single_response.cert_status.status;
    }
    *response_details = OCSPVerifyResult::PROVIDED;
  }

  return result;
}